

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O1

void __thiscall
pobr::imgProcessing::structs::Segment::updatePixels
          (Segment *this,Mat_<cv::Vec<int,_3>_> *segmentedImg,int *segmentID)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t uVar7;
  Mat local_80 [96];
  
  cv::Mat::Mat(local_80,((int)this->yMax - (int)this->yMin) + 1,
               ((int)this->xMax - (int)this->xMin) + 1,0x10);
  cv::Mat::operator=(&(this->pixels).super_Mat,local_80);
  cv::Mat::~Mat(local_80);
  if (this->xMax + 1 != this->xMin) {
    uVar5 = 0;
    do {
      uVar7 = this->yMin;
      if (this->yMax + 1 != uVar7) {
        lVar3 = uVar5 * 3;
        uVar6 = 0;
        do {
          uVar4 = this->xMin;
          lVar1 = **(long **)&segmentedImg->field_0x48;
          lVar2 = *(long *)&segmentedImg->field_0x10;
          *(undefined1 *)
           (**(long **)&(this->pixels).field_0x48 * uVar6 + *(long *)&(this->pixels).field_0x10 + 1
           + lVar3) = 0;
          *(undefined1 *)
           (**(long **)&(this->pixels).field_0x48 * uVar6 + *(long *)&(this->pixels).field_0x10 + 2
           + lVar3) = 0;
          *(char *)(**(long **)&(this->pixels).field_0x48 * uVar6 +
                    *(long *)&(this->pixels).field_0x10 + lVar3) =
               -(*(int *)(((int)uVar7 + (int)uVar6) * lVar1 + lVar2 +
                         (long)((int)uVar4 + (int)uVar5) * 0xc) == *segmentID);
          uVar6 = uVar6 + 1;
          uVar7 = this->yMin;
        } while (uVar6 < (this->yMax - uVar7) + 1);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->xMax - this->xMin) + 1);
  }
  return;
}

Assistant:

const void
Segment::updatePixels(const cv::Mat_<cv::Vec3i>& segmentedImg, const int& segmentID)
{
    this->pixels = cv::Mat_<cv::Vec3b>(
        (this->yMax - this->yMin + 1),
        (this->xMax - this->xMin + 1)
    );

    for (int x = 0; x < (this->xMax - this->xMin + 1); x++) {
        for (int y = 0; y < (this->yMax - this->yMin + 1); y++) {
            auto& thisSegmentID = segmentedImg(this->yMin + y, this->xMin + x)[0];

            this->pixels(y, x)[1] = consts::colors::black;
            this->pixels(y, x)[2] = consts::colors::black;

            if (thisSegmentID != segmentID) {
                this->pixels(y, x)[0] = consts::colors::black;
            } else {
                this->pixels(y, x)[0] = consts::colors::white;
            }
        }
    }
}